

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<unsigned_long_(*)(const_cs_impl::any_&),_unsigned_long_(*)(const_cs_impl::any_&)>::
cni_holder(cni_holder<unsigned_long_(*)(const_cs_impl::any_&),_unsigned_long_(*)(const_cs_impl::any_&)>
           *this,_func_unsigned_long_any_ptr **func)

{
  function<unsigned_long_(const_cs_impl::any_&)> *in_RDI;
  cni_helper<unsigned_long_(*)(const_cs_impl::any_&),_unsigned_long_(*)(const_cs_impl::any_&)>
  *this_00;
  function<unsigned_long_(const_cs_impl::any_&)> *in_stack_ffffffffffffffc0;
  _func_unsigned_long_any_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003bc158;
  this_00 = (cni_helper<unsigned_long_(*)(const_cs_impl::any_&),_unsigned_long_(*)(const_cs_impl::any_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<unsigned_long(cs_impl::any_const&)>::
  function<unsigned_long(*const&)(cs_impl::any_const&),void>(in_stack_ffffffffffffffc0,local_30);
  cni_helper<unsigned_long_(*)(const_cs_impl::any_&),_unsigned_long_(*)(const_cs_impl::any_&)>::
  cni_helper(this_00,in_RDI);
  std::function<unsigned_long_(const_cs_impl::any_&)>::~function
            ((function<unsigned_long_(const_cs_impl::any_&)> *)0x2b6876);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}